

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_floor_variance(gauden_t *g)

{
  float *pfVar1;
  vector_t *ppfVar2;
  vector_t pfVar3;
  float32 fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float64 fVar11;
  float32 fVar12;
  
  if ((g->fullvar != (vector_t ****)0x0) && (g->n_mgau != 0)) {
    uVar9 = 0;
    do {
      if (g->n_feat != 0) {
        uVar10 = 0;
        do {
          if (g->n_density != 0) {
            uVar8 = 0;
            do {
              fVar11 = determinant((float32 **)g->fullvar[uVar9][uVar10][uVar8],g->veclen[uVar10]);
              fVar4 = min_var;
              if (((double)fVar11 <= 0.0) && (uVar5 = (ulong)g->veclen[uVar10], uVar5 != 0)) {
                ppfVar2 = g->fullvar[uVar9][uVar10][uVar8];
                uVar6 = 0;
                do {
                  pfVar3 = ppfVar2[uVar6];
                  uVar7 = 0;
                  do {
                    fVar12 = 0.0;
                    if ((uVar6 != uVar7) ||
                       (pfVar1 = pfVar3 + uVar7, fVar12 = fVar4,
                       *pfVar1 <= (float)fVar4 && (float)fVar4 != *pfVar1)) {
                      pfVar3[uVar7] = (float)fVar12;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar5 != uVar7);
                  uVar6 = uVar6 + 1;
                } while (uVar6 != uVar5);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < g->n_density);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < g->n_feat);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < g->n_mgau);
  }
  if ((g->var != (vector_t ***)0x0) && (g->n_mgau != 0)) {
    uVar9 = 0;
    do {
      if (g->n_feat != 0) {
        uVar10 = 0;
        do {
          if (g->n_density != 0) {
            uVar8 = 0;
            do {
              vector_floor(g->var[uVar9][uVar10][uVar8],g->veclen[uVar10],min_var);
              uVar8 = uVar8 + 1;
            } while (uVar8 < g->n_density);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < g->n_feat);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < g->n_mgau);
  }
  return 0;
}

Assistant:

int
gauden_floor_variance(gauden_t *g)
{
    uint32 i, j, k;

    if (g->fullvar != NULL) {
	/* Don't try to "floor" full covariances since there's no easy
	   way to do this.  If they are singular, discard the
	   off-diagonals and floor the diagonals. */
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    if (determinant(g->fullvar[i][j][k], g->veclen[j]) <= 0.0) {
			diag_and_floor(g->fullvar[i][j][k], g->veclen[j], min_var);
		    }
		}
	    }
	}
    }
    if (g->var != NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    vector_floor(g->var[i][j][k], g->veclen[j], min_var);
		}
	    }
	}
    }

    return S3_SUCCESS;
}